

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_vertical_14_sse2
               (uint16_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  uint16_t uVar28;
  uint16_t uVar29;
  uint16_t uVar30;
  uint16_t uVar31;
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint16_t uVar40;
  uint16_t uVar41;
  undefined1 auVar42 [16];
  undefined8 uVar43;
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [16];
  undefined1 auVar65 [12];
  long lVar66;
  long lVar67;
  long lVar68;
  short sVar69;
  short sVar70;
  undefined4 uVar71;
  undefined1 auVar73 [12];
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar89;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  short sVar83;
  short sVar88;
  short sVar90;
  undefined1 auVar79 [16];
  short sVar84;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  short sVar96;
  undefined1 auVar91 [12];
  undefined2 uVar98;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  short sVar97;
  short sVar99;
  short sVar100;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined4 uVar101;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  short sVar111;
  short sVar112;
  short sVar113;
  undefined1 auVar114 [12];
  short sVar128;
  short sVar131;
  short sVar134;
  short sVar137;
  short sVar139;
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  short sVar129;
  short sVar130;
  short sVar132;
  short sVar133;
  short sVar135;
  short sVar136;
  short sVar138;
  short sVar140;
  undefined1 auVar125 [16];
  short sVar141;
  undefined4 uVar142;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  short sVar154;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar153 [16];
  short sVar156;
  short sVar157;
  short sVar158;
  undefined1 auVar155 [16];
  short sVar159;
  short sVar160;
  short sVar172;
  short sVar174;
  short sVar176;
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  short sVar177;
  short sVar181;
  short sVar182;
  short sVar183;
  undefined1 auVar178 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  ushort uVar191;
  ushort uVar199;
  ushort uVar200;
  ushort uVar201;
  ushort uVar202;
  ushort uVar203;
  ushort uVar204;
  ushort uVar205;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  short sVar206;
  undefined1 auVar207 [12];
  short sVar212;
  short sVar213;
  short sVar214;
  short sVar215;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  short sVar216;
  undefined1 auVar217 [12];
  short sVar219;
  short sVar222;
  short sVar223;
  short sVar224;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  __m128i flat_pq [3];
  __m128i p [7];
  undefined1 auStack_2f8 [16];
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  ushort local_178;
  ushort uStack_176;
  ushort uStack_174;
  ushort uStack_172;
  ushort uStack_170;
  ushort uStack_16e;
  ushort uStack_16c;
  ushort uStack_16a;
  ushort local_168;
  ushort uStack_166;
  ushort uStack_164;
  ushort uStack_162;
  ushort uStack_160;
  ushort uStack_15e;
  ushort uStack_15c;
  ushort uStack_15a;
  ushort local_158;
  ushort uStack_156;
  ushort uStack_154;
  ushort uStack_152;
  ushort uStack_150;
  ushort uStack_14e;
  ushort uStack_14c;
  ushort uStack_14a;
  ushort local_148;
  ushort uStack_146;
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_140;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  ushort local_138;
  ushort uStack_136;
  ushort uStack_134;
  ushort uStack_132;
  ushort uStack_130;
  ushort uStack_12e;
  ushort uStack_12c;
  ushort uStack_12a;
  ushort local_128;
  ushort uStack_126;
  ushort uStack_124;
  ushort uStack_122;
  ushort uStack_120;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  ushort local_118;
  ushort uStack_116;
  ushort uStack_114;
  ushort uStack_112;
  ushort uStack_110;
  ushort uStack_10e;
  ushort uStack_10c;
  ushort uStack_10a;
  ushort local_108;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_100;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  ushort local_f8;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78 [6];
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  ulong local_18;
  undefined8 uStack_10;
  undefined1 auVar72 [12];
  undefined1 auVar74 [16];
  undefined1 auVar82 [16];
  undefined1 auVar102 [12];
  undefined1 auVar105 [16];
  short sVar108;
  short sVar109;
  short sVar110;
  undefined1 auVar116 [16];
  undefined1 auVar126 [16];
  undefined1 auVar117 [16];
  undefined1 auVar127 [16];
  undefined1 auVar143 [16];
  undefined1 auVar150 [16];
  undefined1 auVar144 [16];
  undefined1 auVar151 [16];
  undefined1 auVar145 [16];
  undefined1 auVar152 [16];
  undefined1 auVar162 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  short sVar171;
  short sVar173;
  short sVar175;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar211 [16];
  undefined1 auVar218 [16];
  
  auVar95 = *(undefined1 (*) [16])(s + -8);
  puVar1 = s + (long)pitch + -8;
  uVar23 = *puVar1;
  uVar24 = puVar1[1];
  lVar67 = (long)(pitch * 2);
  auVar107 = *(undefined1 (*) [16])(s + lVar67 + -8);
  lVar68 = (long)(pitch * 3);
  puVar2 = s + lVar68 + -8;
  uVar25 = *puVar2;
  uVar26 = puVar2[1];
  auVar117._0_12_ = auVar95._0_12_;
  auVar117._12_2_ = auVar95._6_2_;
  auVar117._14_2_ = puVar1[3];
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._0_10_ = auVar95._0_10_;
  auVar116._10_2_ = puVar1[2];
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._0_8_ = auVar95._0_8_;
  auVar115._8_2_ = auVar95._4_2_;
  auVar46._4_8_ = auVar115._8_8_;
  auVar46._2_2_ = uVar24;
  auVar46._0_2_ = auVar95._2_2_;
  auVar155._0_8_ = auVar46._0_8_ << 0x20;
  auVar145._0_12_ = auVar107._0_12_;
  auVar145._12_2_ = auVar107._6_2_;
  auVar145._14_2_ = puVar2[3];
  auVar144._12_4_ = auVar145._12_4_;
  auVar144._0_10_ = auVar107._0_10_;
  auVar144._10_2_ = puVar2[2];
  auVar143._10_6_ = auVar144._10_6_;
  auVar143._0_8_ = auVar107._0_8_;
  auVar143._8_2_ = auVar107._4_2_;
  auVar47._4_8_ = auVar143._8_8_;
  auVar47._2_2_ = uVar26;
  auVar47._0_2_ = auVar107._2_2_;
  uVar142 = CONCAT22(uVar25,auVar107._0_2_);
  auVar155._8_4_ = auVar46._0_4_;
  auVar155._12_4_ = auVar47._0_4_;
  auVar118._0_8_ = CONCAT44(auVar143._8_4_,auVar115._8_4_);
  auVar118._8_4_ = auVar116._12_4_;
  auVar118._12_4_ = auVar144._12_4_;
  local_88 = auVar155._8_8_;
  uStack_80 = 0;
  local_98 = auVar118._0_8_;
  uStack_90 = 0;
  local_a8 = auVar118 >> 0x40;
  uVar71 = CONCAT22(puVar1[4],auVar95._8_2_);
  auVar72._0_8_ = CONCAT26(puVar1[5],CONCAT24(auVar95._10_2_,uVar71));
  auVar72._8_2_ = auVar95._12_2_;
  auVar72._10_2_ = puVar1[6];
  auVar74._12_2_ = auVar95._14_2_;
  auVar74._0_12_ = auVar72;
  auVar74._14_2_ = puVar1[7];
  uVar101 = CONCAT22(puVar2[4],auVar107._8_2_);
  auVar102._0_8_ = CONCAT26(puVar2[5],CONCAT24(auVar107._10_2_,uVar101));
  auVar102._8_2_ = auVar107._12_2_;
  auVar102._10_2_ = puVar2[6];
  auVar92._12_2_ = auVar107._14_2_;
  auVar92._0_12_ = auVar102;
  auVar92._14_2_ = puVar2[7];
  auVar75._8_4_ = (int)((ulong)auVar72._0_8_ >> 0x20);
  auVar75._0_8_ = auVar72._0_8_;
  auVar75._12_4_ = (int)((ulong)auVar102._0_8_ >> 0x20);
  auVar106._0_8_ = CONCAT44(auVar102._8_4_,auVar72._8_4_);
  auVar106._8_4_ = auVar74._12_4_;
  auVar106._12_4_ = auVar92._12_4_;
  local_b8 = CONCAT44(uVar101,uVar71);
  uStack_b0 = 0;
  local_c8 = auVar75._8_8_;
  uStack_c0 = 0;
  local_d8 = auVar106._0_8_;
  uStack_d0 = 0;
  local_e8 = auVar106 >> 0x40;
  auVar74 = *(undefined1 (*) [16])s;
  puVar1 = s + pitch;
  uVar27 = *puVar1;
  uVar28 = puVar1[1];
  uVar29 = puVar1[2];
  uVar30 = puVar1[3];
  uVar31 = puVar1[4];
  uVar32 = puVar1[5];
  uVar33 = puVar1[6];
  uVar34 = puVar1[7];
  auVar106 = *(undefined1 (*) [16])(s + lVar67);
  puVar1 = s + lVar68;
  uVar35 = *puVar1;
  uVar36 = puVar1[1];
  uVar37 = puVar1[2];
  uVar38 = puVar1[3];
  uVar39 = puVar1[4];
  uVar40 = puVar1[5];
  uVar41 = puVar1[6];
  sVar175 = auVar74._6_2_;
  auVar164._0_12_ = auVar74._0_12_;
  auVar164._12_2_ = sVar175;
  auVar164._14_2_ = uVar30;
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._0_10_ = auVar74._0_10_;
  auVar163._10_2_ = uVar29;
  sVar173 = auVar74._4_2_;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._0_8_ = auVar74._0_8_;
  auVar162._8_2_ = sVar173;
  auVar48._4_8_ = auVar162._8_8_;
  auVar48._2_2_ = uVar28;
  sVar171 = auVar74._2_2_;
  auVar48._0_2_ = sVar171;
  sVar84 = auVar74._0_2_;
  auVar161._0_4_ = CONCAT22(uVar27,sVar84);
  auVar161._4_12_ = auVar48;
  sVar110 = auVar106._6_2_;
  auVar120._0_12_ = auVar106._0_12_;
  auVar120._12_2_ = sVar110;
  auVar120._14_2_ = uVar38;
  auVar105._12_4_ = auVar120._12_4_;
  auVar105._0_10_ = auVar106._0_10_;
  auVar105._10_2_ = uVar37;
  sVar109 = auVar106._4_2_;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._0_8_ = auVar106._0_8_;
  auVar104._8_2_ = sVar109;
  auVar49._4_8_ = auVar104._8_8_;
  auVar49._2_2_ = uVar36;
  sVar108 = auVar106._2_2_;
  auVar49._0_2_ = sVar108;
  sVar70 = auVar106._0_2_;
  auVar146._0_8_ = auVar161._0_8_;
  auVar146._8_4_ = auVar48._0_4_;
  auVar146._12_4_ = auVar49._0_4_;
  auVar165._0_8_ = CONCAT44(auVar104._8_4_,auVar162._8_4_);
  auVar165._8_4_ = auVar163._12_4_;
  auVar165._12_4_ = auVar105._12_4_;
  local_78[0] = CONCAT44(CONCAT22(uVar35,sVar70),auVar161._0_4_);
  local_78[1] = 0;
  local_78[2] = auVar146._8_8_;
  local_78[3] = 0;
  local_78[4] = auVar165._0_8_;
  local_78[5] = 0;
  local_48 = auVar165 >> 0x40;
  uVar101 = CONCAT22(uVar31,auVar74._8_2_);
  auVar114._0_8_ = CONCAT26(uVar32,CONCAT24(auVar74._10_2_,uVar101));
  auVar114._8_2_ = auVar74._12_2_;
  auVar114._10_2_ = uVar33;
  uVar71 = CONCAT22(uVar39,auVar106._8_2_);
  auVar91._0_8_ = CONCAT26(uVar40,CONCAT24(auVar106._10_2_,uVar71));
  uVar98 = auVar106._12_2_;
  auVar91._8_2_ = uVar98;
  auVar91._10_2_ = uVar41;
  auVar103._8_4_ = (int)((ulong)auVar114._0_8_ >> 0x20);
  auVar103._0_8_ = auVar114._0_8_;
  auVar103._12_4_ = (int)((ulong)auVar91._0_8_ >> 0x20);
  local_18 = CONCAT44(auVar91._8_4_,auVar114._8_4_);
  local_38 = CONCAT44(uVar71,uVar101);
  uStack_30 = 0;
  local_28 = auVar103._8_8_;
  uStack_20 = 0;
  uStack_10 = 0;
  auVar75 = *(undefined1 (*) [16])blimit;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar75._0_13_;
  auVar3[0xe] = auVar75[7];
  auVar6[0xc] = auVar75[6];
  auVar6._0_12_ = auVar75._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar75._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar75[5];
  auVar12._0_10_ = auVar75._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar75._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar75[4];
  auVar18._0_8_ = auVar75._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar18._8_7_;
  auVar58._1_8_ = SUB158(auVar50 << 0x40,7);
  auVar58[0] = auVar75[3];
  auVar58._9_6_ = 0;
  auVar59._1_10_ = SUB1510(auVar58 << 0x30,5);
  auVar59[0] = auVar75[2];
  auVar59._11_4_ = 0;
  auVar21[2] = auVar75[1];
  auVar21._0_2_ = auVar75._0_2_;
  auVar21._3_12_ = SUB1512(auVar59 << 0x20,3);
  auVar119._0_2_ = auVar75._0_2_ & 0xff;
  auVar119._2_13_ = auVar21._2_13_;
  auVar119[0xf] = 0;
  auVar75 = *(undefined1 (*) [16])limit;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar75._0_13_;
  auVar4[0xe] = auVar75[7];
  auVar7[0xc] = auVar75[6];
  auVar7._0_12_ = auVar75._0_12_;
  auVar7._13_2_ = auVar4._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar75._0_11_;
  auVar10._12_3_ = auVar7._12_3_;
  auVar13[10] = auVar75[5];
  auVar13._0_10_ = auVar75._0_10_;
  auVar13._11_4_ = auVar10._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = auVar75._0_9_;
  auVar16._10_5_ = auVar13._10_5_;
  auVar19[8] = auVar75[4];
  auVar19._0_8_ = auVar75._0_8_;
  auVar19._9_6_ = auVar16._9_6_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar19._8_7_;
  auVar60._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar60[0] = auVar75[3];
  auVar60._9_6_ = 0;
  auVar61._1_10_ = SUB1510(auVar60 << 0x30,5);
  auVar61[0] = auVar75[2];
  auVar61._11_4_ = 0;
  auVar22[2] = auVar75[1];
  auVar22._0_2_ = auVar75._0_2_;
  auVar22._3_12_ = SUB1512(auVar61 << 0x20,3);
  auVar208._0_2_ = auVar75._0_2_ & 0xff;
  auVar208._2_13_ = auVar22._2_13_;
  auVar208[0xf] = 0;
  auVar75 = *(undefined1 (*) [16])thresh;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar75._0_13_;
  auVar5[0xe] = auVar75[7];
  auVar8[0xc] = auVar75[6];
  auVar8._0_12_ = auVar75._0_12_;
  auVar8._13_2_ = auVar5._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar75._0_11_;
  auVar11._12_3_ = auVar8._12_3_;
  auVar14[10] = auVar75[5];
  auVar14._0_10_ = auVar75._0_10_;
  auVar14._11_4_ = auVar11._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = auVar75._0_9_;
  auVar17._10_5_ = auVar14._10_5_;
  auVar20[8] = auVar75[4];
  auVar20._0_8_ = auVar75._0_8_;
  auVar20._9_6_ = auVar17._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar20._8_7_;
  auVar62._1_8_ = SUB158(auVar52 << 0x40,7);
  auVar62[0] = auVar75[3];
  auVar62._9_6_ = 0;
  auVar63._1_10_ = SUB1510(auVar62 << 0x30,5);
  auVar63[0] = auVar75[2];
  auVar63._11_4_ = 0;
  auVar185._3_12_ = SUB1512(auVar63 << 0x20,3);
  auVar185[2] = auVar75[1];
  auVar185[0] = auVar75[0];
  auVar185[1] = 0;
  auVar185[0xf] = 0;
  lVar66 = 0;
  do {
    *(undefined8 *)((long)&local_2e8 + lVar66) = *(undefined8 *)(local_e8 + lVar66);
    *(undefined8 *)((long)&sStack_2e0 + lVar66) = *(undefined8 *)((long)local_78 + lVar66);
    lVar66 = lVar66 + 0x10;
  } while (lVar66 != 0x70);
  auVar92 = ZEXT416(bd - 8);
  auVar120 = psllw(auVar119,auVar92);
  auVar103 = psllw(auVar208,auVar92);
  auVar75 = psllw(auVar185,auVar92);
  uVar43 = CONCAT26(sStack_2e2,CONCAT24(sStack_2e4,CONCAT22(sStack_2e6,local_2e8)));
  auVar42._8_2_ = sStack_2e0;
  auVar42._0_8_ = uVar43;
  auVar42._10_2_ = sStack_2de;
  auVar42._12_2_ = sStack_2dc;
  auVar42._14_2_ = sStack_2da;
  uVar45 = CONCAT26(sStack_2d2,CONCAT24(sStack_2d4,CONCAT22(sStack_2d6,local_2d8)));
  auVar44._8_2_ = sStack_2d0;
  auVar44._0_8_ = uVar45;
  auVar44._10_2_ = sStack_2ce;
  auVar44._12_2_ = sStack_2cc;
  auVar44._14_2_ = sStack_2ca;
  auVar184._8_8_ = uVar45;
  auVar184._0_8_ = uVar43;
  auVar147._8_8_ = auVar44._8_8_;
  auVar147._0_8_ = auVar42._8_8_;
  auVar185 = psubusw(auVar184,auVar147);
  auVar208 = psubusw(auVar147,auVar184);
  auVar208 = auVar208 | auVar185;
  auVar185 = paddusw(auVar208,auVar208);
  auVar186._0_8_ = auVar185._0_8_;
  auVar186._8_8_ = 0;
  auVar209._0_2_ = auVar208._8_2_ >> 1;
  auVar209._2_2_ = auVar208._10_2_ >> 1;
  auVar209._4_2_ = auVar208._12_2_ >> 1;
  auVar209._6_2_ = auVar208._14_2_ >> 1;
  auVar209._8_8_ = 0;
  auVar185 = paddusw(auVar209,auVar186);
  auVar185 = auVar185 ^ _DAT_004d9b50;
  auVar120 = auVar120 ^ _DAT_004d9b50;
  auVar210._0_2_ = -(ushort)(auVar120._0_2_ < auVar185._0_2_);
  auVar210._2_2_ = -(ushort)(auVar120._2_2_ < auVar185._2_2_);
  auVar210._4_2_ = -(ushort)(auVar120._4_2_ < auVar185._4_2_);
  auVar210._6_2_ = -(ushort)(auVar120._6_2_ < auVar185._6_2_);
  auVar210._8_2_ = -(ushort)(auVar120._8_2_ < auVar185._8_2_);
  auVar210._10_2_ = -(ushort)(auVar120._10_2_ < auVar185._10_2_);
  auVar210._12_2_ = -(ushort)(auVar120._12_2_ < auVar185._12_2_);
  auVar210._14_2_ = -(ushort)(auVar120._14_2_ < auVar185._14_2_);
  auVar120 = paddusw(_DAT_005147c0,auVar103);
  auVar120 = auVar120 & auVar210;
  auVar185 = psubusw(auVar42,auVar44);
  auVar208 = psubusw(auVar44,auVar42);
  auVar208 = auVar208 | auVar185;
  sVar87 = auVar208._0_2_;
  sVar111 = auVar208._8_2_;
  auVar121._0_2_ = (ushort)(sVar111 < sVar87) * sVar87 | (ushort)(sVar111 >= sVar87) * sVar111;
  sVar88 = auVar208._2_2_;
  sVar128 = auVar208._10_2_;
  auVar121._2_2_ = (ushort)(sVar128 < sVar88) * sVar88 | (ushort)(sVar128 >= sVar88) * sVar128;
  sVar89 = auVar208._4_2_;
  sVar131 = auVar208._12_2_;
  auVar121._4_2_ = (ushort)(sVar131 < sVar89) * sVar89 | (ushort)(sVar131 >= sVar89) * sVar131;
  sVar90 = auVar208._6_2_;
  sVar134 = auVar208._14_2_;
  auVar121._6_2_ = (ushort)(sVar134 < sVar90) * sVar90 | (ushort)(sVar134 >= sVar90) * sVar134;
  sVar69 = (ushort)(0 < sVar111) * sVar111;
  auVar121._8_2_ = sVar69;
  sVar86 = (ushort)(0 < sVar128) * sVar128;
  auVar121._10_2_ = sVar86;
  sVar85 = (ushort)(0 < sVar131) * sVar131;
  auVar121._12_2_ = sVar85;
  sVar83 = (ushort)(0 < sVar134) * sVar134;
  auVar121._14_2_ = sVar83;
  sVar156 = auVar120._0_2_;
  uVar191 = (sVar156 < (short)auVar121._0_2_) * auVar121._0_2_ |
            (ushort)(sVar156 >= (short)auVar121._0_2_) * sVar156;
  sVar156 = auVar120._2_2_;
  uVar199 = (sVar156 < (short)auVar121._2_2_) * auVar121._2_2_ |
            (ushort)(sVar156 >= (short)auVar121._2_2_) * sVar156;
  sVar156 = auVar120._4_2_;
  uVar200 = (sVar156 < (short)auVar121._4_2_) * auVar121._4_2_ |
            (ushort)(sVar156 >= (short)auVar121._4_2_) * sVar156;
  sVar156 = auVar120._6_2_;
  uVar201 = (sVar156 < (short)auVar121._6_2_) * auVar121._6_2_ |
            (ushort)(sVar156 >= (short)auVar121._6_2_) * sVar156;
  sVar156 = auVar120._8_2_;
  uVar202 = (ushort)(sVar156 < sVar69) * sVar69 | (ushort)(sVar156 >= sVar69) * sVar156;
  sVar69 = auVar120._10_2_;
  uVar203 = (ushort)(sVar69 < sVar86) * sVar86 | (ushort)(sVar69 >= sVar86) * sVar69;
  sVar69 = auVar120._12_2_;
  sVar86 = auVar120._14_2_;
  uVar204 = (ushort)(sVar69 < sVar85) * sVar85 | (ushort)(sVar69 >= sVar85) * sVar69;
  uVar205 = (ushort)(sVar86 < sVar83) * sVar83 | (ushort)(sVar86 >= sVar83) * sVar86;
  auVar121 = auVar121 ^ _DAT_004d9b50;
  auVar75 = auVar75 ^ _DAT_004d9b50;
  auVar122._0_4_ =
       CONCAT22(-(ushort)(auVar75._2_2_ < auVar121._2_2_),-(ushort)(auVar75._0_2_ < auVar121._0_2_))
  ;
  lVar66 = 0x20;
  do {
    auVar208 = psubusw(*(undefined1 (*) [16])((long)&local_2e8 + lVar66),
                       *(undefined1 (*) [16])(auStack_2f8 + lVar66));
    auVar185 = psubusw(*(undefined1 (*) [16])(auStack_2f8 + lVar66),
                       *(undefined1 (*) [16])((long)&local_2e8 + lVar66));
    auVar185 = auVar185 | auVar208;
    sVar69 = auVar185._0_2_;
    uVar191 = (ushort)((short)uVar191 < sVar69) * sVar69 | ((short)uVar191 >= sVar69) * uVar191;
    sVar69 = auVar185._2_2_;
    uVar199 = (ushort)((short)uVar199 < sVar69) * sVar69 | ((short)uVar199 >= sVar69) * uVar199;
    sVar69 = auVar185._4_2_;
    uVar200 = (ushort)((short)uVar200 < sVar69) * sVar69 | ((short)uVar200 >= sVar69) * uVar200;
    sVar69 = auVar185._6_2_;
    uVar201 = (ushort)((short)uVar201 < sVar69) * sVar69 | ((short)uVar201 >= sVar69) * uVar201;
    sVar69 = auVar185._8_2_;
    uVar202 = (ushort)((short)uVar202 < sVar69) * sVar69 | ((short)uVar202 >= sVar69) * uVar202;
    sVar69 = auVar185._10_2_;
    uVar203 = (ushort)((short)uVar203 < sVar69) * sVar69 | ((short)uVar203 >= sVar69) * uVar203;
    sVar69 = auVar185._12_2_;
    uVar204 = (ushort)((short)uVar204 < sVar69) * sVar69 | ((short)uVar204 >= sVar69) * uVar204;
    sVar69 = auVar185._14_2_;
    uVar205 = (ushort)((short)uVar205 < sVar69) * sVar69 | ((short)uVar205 >= sVar69) * uVar205;
    lVar66 = lVar66 + 0x10;
  } while (lVar66 != 0x40);
  auVar185 = pshuflw(auVar185,ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f))),0);
  auVar76._0_4_ = auVar185._0_4_;
  auVar76._4_4_ = auVar76._0_4_;
  auVar76._8_4_ = auVar76._0_4_;
  auVar76._12_4_ = auVar76._0_4_;
  auVar122._4_4_ =
       (undefined4)
       (CONCAT26(-(ushort)(auVar75._6_2_ < auVar121._6_2_),
                 CONCAT24(-(ushort)(auVar75._4_2_ < auVar121._4_2_),auVar122._0_4_)) >> 0x20);
  auVar122._8_4_ = auVar122._0_4_;
  auVar122._12_4_ = auVar122._4_4_;
  auVar225._0_2_ =
       ((short)uVar202 < (short)uVar191) * uVar191 | ((short)uVar202 >= (short)uVar191) * uVar202;
  auVar225._2_2_ =
       ((short)uVar203 < (short)uVar199) * uVar199 | ((short)uVar203 >= (short)uVar199) * uVar203;
  auVar225._4_2_ =
       ((short)uVar204 < (short)uVar200) * uVar200 | ((short)uVar204 >= (short)uVar200) * uVar204;
  auVar225._6_2_ =
       ((short)uVar205 < (short)uVar201) * uVar201 | ((short)uVar205 >= (short)uVar201) * uVar205;
  auVar225._8_2_ = (0 < (short)uVar202) * uVar202;
  auVar225._10_2_ = (0 < (short)uVar203) * uVar203;
  auVar225._12_2_ = (0 < (short)uVar204) * uVar204;
  auVar225._14_2_ = (0 < (short)uVar205) * uVar205;
  auVar185 = psubusw(auVar225,auVar103);
  auVar75 = psllw(_DAT_005147c0,ZEXT416((uint)bd));
  auVar226._0_2_ = -(ushort)(auVar185._0_2_ == 0);
  auVar226._2_2_ = -(ushort)(auVar185._2_2_ == 0);
  auVar226._4_2_ = -(ushort)(auVar185._4_2_ == 0);
  auVar226._6_2_ = -(ushort)(auVar185._6_2_ == 0);
  auVar226._8_2_ = -(ushort)(auVar185._8_2_ == 0);
  auVar226._10_2_ = -(ushort)(auVar185._10_2_ == 0);
  auVar226._12_2_ = -(ushort)(auVar185._12_2_ == 0);
  auVar226._14_2_ = -(ushort)(auVar185._14_2_ == 0);
  auVar192._8_4_ = 0xffffffff;
  auVar192._0_8_ = 0xffffffffffffffff;
  auVar192._12_4_ = 0xffffffff;
  auVar75 = paddsw(auVar75,auVar192);
  auVar208 = psubsw(auVar75,auVar76);
  auVar120 = psubsw((undefined1  [16])0x0,auVar76);
  auVar185 = psubsw(auVar184,auVar76);
  auVar75 = psubsw(auVar147,auVar76);
  auVar103 = psubsw(auVar185,auVar75);
  sVar160 = auVar208._0_2_;
  sVar69 = auVar103._0_2_;
  uVar191 = (ushort)(sVar160 < sVar69) * sVar160 | (ushort)(sVar160 >= sVar69) * sVar69;
  sVar172 = auVar208._2_2_;
  sVar69 = auVar103._2_2_;
  uVar199 = (ushort)(sVar172 < sVar69) * sVar172 | (ushort)(sVar172 >= sVar69) * sVar69;
  sVar174 = auVar208._4_2_;
  sVar69 = auVar103._4_2_;
  uVar200 = (ushort)(sVar174 < sVar69) * sVar174 | (ushort)(sVar174 >= sVar69) * sVar69;
  sVar176 = auVar208._6_2_;
  sVar69 = auVar103._6_2_;
  uVar201 = (ushort)(sVar176 < sVar69) * sVar176 | (ushort)(sVar176 >= sVar69) * sVar69;
  sVar206 = auVar208._8_2_;
  sVar69 = auVar103._8_2_;
  uVar202 = (ushort)(sVar206 < sVar69) * sVar206 | (ushort)(sVar206 >= sVar69) * sVar69;
  sVar212 = auVar208._10_2_;
  sVar69 = auVar103._10_2_;
  uVar203 = (ushort)(sVar212 < sVar69) * sVar212 | (ushort)(sVar212 >= sVar69) * sVar69;
  sVar213 = auVar208._12_2_;
  sVar69 = auVar103._12_2_;
  sVar83 = auVar103._14_2_;
  uVar204 = (ushort)(sVar213 < sVar69) * sVar213 | (ushort)(sVar213 >= sVar69) * sVar69;
  sVar214 = auVar208._14_2_;
  uVar205 = (ushort)(sVar214 < sVar83) * sVar214 | (ushort)(sVar214 >= sVar83) * sVar83;
  sVar69 = auVar120._0_2_;
  auVar187._0_2_ = (ushort)((short)uVar191 < sVar69) * sVar69 | ((short)uVar191 >= sVar69) * uVar191
  ;
  sVar83 = auVar120._2_2_;
  auVar187._2_2_ = (ushort)((short)uVar199 < sVar83) * sVar83 | ((short)uVar199 >= sVar83) * uVar199
  ;
  sVar85 = auVar120._4_2_;
  auVar187._4_2_ = (ushort)((short)uVar200 < sVar85) * sVar85 | ((short)uVar200 >= sVar85) * uVar200
  ;
  sVar86 = auVar120._6_2_;
  auVar187._6_2_ = (ushort)((short)uVar201 < sVar86) * sVar86 | ((short)uVar201 >= sVar86) * uVar201
  ;
  sVar156 = auVar120._8_2_;
  auVar187._8_2_ =
       (ushort)((short)uVar202 < sVar156) * sVar156 | ((short)uVar202 >= sVar156) * uVar202;
  sVar157 = auVar120._10_2_;
  auVar187._10_2_ =
       (ushort)((short)uVar203 < sVar157) * sVar157 | ((short)uVar203 >= sVar157) * uVar203;
  sVar158 = auVar120._12_2_;
  auVar187._12_2_ =
       (ushort)((short)uVar204 < sVar158) * sVar158 | ((short)uVar204 >= sVar158) * uVar204;
  sVar159 = auVar120._14_2_;
  auVar187._14_2_ =
       (ushort)((short)uVar205 < sVar159) * sVar159 | ((short)uVar205 >= sVar159) * uVar205;
  auVar103 = psubsw(auVar187 >> 0x40 & auVar122,auVar187);
  auVar103 = psubsw(auVar103,auVar187);
  auVar103 = psubsw(auVar103,auVar187);
  sVar141 = auVar103._0_2_;
  uVar191 = (ushort)(sVar160 < sVar141) * sVar160 | (ushort)(sVar160 >= sVar141) * sVar141;
  sVar141 = auVar103._2_2_;
  uVar199 = (ushort)(sVar172 < sVar141) * sVar172 | (ushort)(sVar172 >= sVar141) * sVar141;
  sVar141 = auVar103._4_2_;
  uVar200 = (ushort)(sVar174 < sVar141) * sVar174 | (ushort)(sVar174 >= sVar141) * sVar141;
  sVar141 = auVar103._6_2_;
  uVar201 = (ushort)(sVar176 < sVar141) * sVar176 | (ushort)(sVar176 >= sVar141) * sVar141;
  sVar141 = auVar103._8_2_;
  uVar202 = (ushort)(sVar206 < sVar141) * sVar206 | (ushort)(sVar206 >= sVar141) * sVar141;
  sVar141 = auVar103._10_2_;
  uVar203 = (ushort)(sVar212 < sVar141) * sVar212 | (ushort)(sVar212 >= sVar141) * sVar141;
  sVar141 = auVar103._12_2_;
  sVar154 = auVar103._14_2_;
  uVar204 = (ushort)(sVar213 < sVar141) * sVar213 | (ushort)(sVar213 >= sVar141) * sVar141;
  uVar205 = (ushort)(sVar214 < sVar154) * sVar214 | (ushort)(sVar214 >= sVar154) * sVar154;
  auVar220._0_2_ = (ushort)((short)uVar191 < sVar69) * sVar69 | ((short)uVar191 >= sVar69) * uVar191
  ;
  auVar220._2_2_ = (ushort)((short)uVar199 < sVar83) * sVar83 | ((short)uVar199 >= sVar83) * uVar199
  ;
  auVar220._4_2_ = (ushort)((short)uVar200 < sVar85) * sVar85 | ((short)uVar200 >= sVar85) * uVar200
  ;
  auVar220._6_2_ = (ushort)((short)uVar201 < sVar86) * sVar86 | ((short)uVar201 >= sVar86) * uVar201
  ;
  auVar220._8_2_ =
       (ushort)((short)uVar202 < sVar156) * sVar156 | ((short)uVar202 >= sVar156) * uVar202;
  auVar220._10_2_ =
       (ushort)((short)uVar203 < sVar157) * sVar157 | ((short)uVar203 >= sVar157) * uVar203;
  auVar220._12_2_ =
       (ushort)((short)uVar204 < sVar158) * sVar158 | ((short)uVar204 >= sVar158) * uVar204;
  auVar220._14_2_ =
       (ushort)((short)uVar205 < sVar159) * sVar159 | ((short)uVar205 >= sVar159) * uVar205;
  auVar220 = auVar220 & auVar226;
  auVar188._0_8_ = auVar220._0_8_;
  auVar188._8_4_ = auVar220._0_4_;
  auVar188._12_4_ = auVar220._4_4_;
  auVar103 = paddsw(auVar188,_DAT_005147d0);
  sVar141 = auVar103._0_2_;
  uVar191 = (ushort)(sVar160 < sVar141) * sVar160 | (ushort)(sVar160 >= sVar141) * sVar141;
  sVar141 = auVar103._2_2_;
  uVar199 = (ushort)(sVar172 < sVar141) * sVar172 | (ushort)(sVar172 >= sVar141) * sVar141;
  sVar141 = auVar103._4_2_;
  uVar200 = (ushort)(sVar174 < sVar141) * sVar174 | (ushort)(sVar174 >= sVar141) * sVar141;
  sVar141 = auVar103._6_2_;
  uVar201 = (ushort)(sVar176 < sVar141) * sVar176 | (ushort)(sVar176 >= sVar141) * sVar141;
  sVar141 = auVar103._8_2_;
  uVar202 = (ushort)(sVar206 < sVar141) * sVar206 | (ushort)(sVar206 >= sVar141) * sVar141;
  sVar141 = auVar103._10_2_;
  uVar203 = (ushort)(sVar212 < sVar141) * sVar212 | (ushort)(sVar212 >= sVar141) * sVar141;
  sVar141 = auVar103._12_2_;
  sVar154 = auVar103._14_2_;
  uVar204 = (ushort)(sVar213 < sVar141) * sVar213 | (ushort)(sVar213 >= sVar141) * sVar141;
  uVar205 = (ushort)(sVar214 < sVar154) * sVar214 | (ushort)(sVar214 >= sVar154) * sVar154;
  auVar189._0_2_ = (ushort)((short)uVar191 < sVar69) * sVar69 | ((short)uVar191 >= sVar69) * uVar191
  ;
  auVar189._2_2_ = (ushort)((short)uVar199 < sVar83) * sVar83 | ((short)uVar199 >= sVar83) * uVar199
  ;
  auVar189._4_2_ = (ushort)((short)uVar200 < sVar85) * sVar85 | ((short)uVar200 >= sVar85) * uVar200
  ;
  auVar189._6_2_ = (ushort)((short)uVar201 < sVar86) * sVar86 | ((short)uVar201 >= sVar86) * uVar201
  ;
  auVar189._8_2_ =
       (ushort)((short)uVar202 < sVar156) * sVar156 | ((short)uVar202 >= sVar156) * uVar202;
  auVar189._10_2_ =
       (ushort)((short)uVar203 < sVar157) * sVar157 | ((short)uVar203 >= sVar157) * uVar203;
  auVar189._12_2_ =
       (ushort)((short)uVar204 < sVar158) * sVar158 | ((short)uVar204 >= sVar158) * uVar204;
  auVar189._14_2_ =
       (ushort)((short)uVar205 < sVar159) * sVar159 | ((short)uVar205 >= sVar159) * uVar205;
  auVar103 = psraw(auVar189,3);
  auVar221._0_2_ = auVar103._0_2_ + 1;
  auVar221._2_2_ = auVar103._2_2_ + 1;
  auVar221._4_2_ = auVar103._4_2_ + 1;
  auVar221._6_2_ = auVar103._6_2_ + 1;
  auVar221._8_2_ = auVar103._0_2_ + 1;
  auVar221._10_2_ = auVar103._2_2_ + 1;
  auVar221._12_2_ = auVar103._4_2_ + 1;
  auVar221._14_2_ = auVar103._6_2_ + 1;
  auVar208 = psraw(auVar221,1);
  auVar193._8_8_ = SUB168(~auVar122 & auVar208,8);
  auVar193._0_8_ = auVar103._8_8_;
  auVar190._8_8_ = SUB168(~auVar122 & auVar208,0);
  auVar190._0_8_ = auVar103._0_8_;
  auVar75 = psubsw(auVar75,auVar190);
  auVar185 = paddsw(auVar193,auVar185);
  sVar141 = auVar75._0_2_;
  uVar191 = (ushort)(sVar160 < sVar141) * sVar160 | (ushort)(sVar160 >= sVar141) * sVar141;
  sVar141 = auVar75._2_2_;
  uVar199 = (ushort)(sVar172 < sVar141) * sVar172 | (ushort)(sVar172 >= sVar141) * sVar141;
  sVar141 = auVar75._4_2_;
  uVar200 = (ushort)(sVar174 < sVar141) * sVar174 | (ushort)(sVar174 >= sVar141) * sVar141;
  sVar141 = auVar75._6_2_;
  uVar201 = (ushort)(sVar176 < sVar141) * sVar176 | (ushort)(sVar176 >= sVar141) * sVar141;
  sVar141 = auVar75._8_2_;
  uVar202 = (ushort)(sVar206 < sVar141) * sVar206 | (ushort)(sVar206 >= sVar141) * sVar141;
  sVar141 = auVar75._10_2_;
  uVar203 = (ushort)(sVar212 < sVar141) * sVar212 | (ushort)(sVar212 >= sVar141) * sVar141;
  sVar141 = auVar75._12_2_;
  sVar154 = auVar75._14_2_;
  uVar204 = (ushort)(sVar213 < sVar141) * sVar213 | (ushort)(sVar213 >= sVar141) * sVar141;
  uVar205 = (ushort)(sVar214 < sVar154) * sVar214 | (ushort)(sVar214 >= sVar154) * sVar154;
  auVar148._0_2_ = (ushort)((short)uVar191 < sVar69) * sVar69 | ((short)uVar191 >= sVar69) * uVar191
  ;
  auVar148._2_2_ = (ushort)((short)uVar199 < sVar83) * sVar83 | ((short)uVar199 >= sVar83) * uVar199
  ;
  auVar148._4_2_ = (ushort)((short)uVar200 < sVar85) * sVar85 | ((short)uVar200 >= sVar85) * uVar200
  ;
  auVar148._6_2_ = (ushort)((short)uVar201 < sVar86) * sVar86 | ((short)uVar201 >= sVar86) * uVar201
  ;
  auVar148._8_2_ =
       (ushort)((short)uVar202 < sVar156) * sVar156 | ((short)uVar202 >= sVar156) * uVar202;
  auVar148._10_2_ =
       (ushort)((short)uVar203 < sVar157) * sVar157 | ((short)uVar203 >= sVar157) * uVar203;
  auVar148._12_2_ =
       (ushort)((short)uVar204 < sVar158) * sVar158 | ((short)uVar204 >= sVar158) * uVar204;
  auVar148._14_2_ =
       (ushort)((short)uVar205 < sVar159) * sVar159 | ((short)uVar205 >= sVar159) * uVar205;
  sVar141 = auVar185._0_2_;
  uVar191 = (ushort)(sVar160 < sVar141) * sVar160 | (ushort)(sVar160 >= sVar141) * sVar141;
  sVar160 = auVar185._2_2_;
  uVar199 = (ushort)(sVar172 < sVar160) * sVar172 | (ushort)(sVar172 >= sVar160) * sVar160;
  sVar160 = auVar185._4_2_;
  uVar200 = (ushort)(sVar174 < sVar160) * sVar174 | (ushort)(sVar174 >= sVar160) * sVar160;
  sVar160 = auVar185._6_2_;
  uVar201 = (ushort)(sVar176 < sVar160) * sVar176 | (ushort)(sVar176 >= sVar160) * sVar160;
  sVar160 = auVar185._8_2_;
  uVar202 = (ushort)(sVar206 < sVar160) * sVar206 | (ushort)(sVar206 >= sVar160) * sVar160;
  sVar160 = auVar185._10_2_;
  uVar203 = (ushort)(sVar212 < sVar160) * sVar212 | (ushort)(sVar212 >= sVar160) * sVar160;
  sVar160 = auVar185._12_2_;
  sVar172 = auVar185._14_2_;
  uVar204 = (ushort)(sVar213 < sVar160) * sVar213 | (ushort)(sVar213 >= sVar160) * sVar160;
  uVar205 = (ushort)(sVar214 < sVar172) * sVar214 | (ushort)(sVar214 >= sVar172) * sVar172;
  auVar194._0_2_ = (ushort)((short)uVar191 < sVar69) * sVar69 | ((short)uVar191 >= sVar69) * uVar191
  ;
  auVar194._2_2_ = (ushort)((short)uVar199 < sVar83) * sVar83 | ((short)uVar199 >= sVar83) * uVar199
  ;
  auVar194._4_2_ = (ushort)((short)uVar200 < sVar85) * sVar85 | ((short)uVar200 >= sVar85) * uVar200
  ;
  auVar194._6_2_ = (ushort)((short)uVar201 < sVar86) * sVar86 | ((short)uVar201 >= sVar86) * uVar201
  ;
  auVar194._8_2_ =
       (ushort)((short)uVar202 < sVar156) * sVar156 | ((short)uVar202 >= sVar156) * uVar202;
  auVar194._10_2_ =
       (ushort)((short)uVar203 < sVar157) * sVar157 | ((short)uVar203 >= sVar157) * uVar203;
  auVar194._12_2_ =
       (ushort)((short)uVar204 < sVar158) * sVar158 | ((short)uVar204 >= sVar158) * uVar204;
  auVar194._14_2_ =
       (ushort)((short)uVar205 < sVar159) * sVar159 | ((short)uVar205 >= sVar159) * uVar205;
  auVar208 = paddsw(auVar148,auVar76);
  auVar120 = paddsw(auVar194,auVar76);
  auVar75 = psubusw(local_2c8,auVar42);
  auVar185 = psubusw(auVar42,local_2c8);
  auVar185 = auVar185 | auVar75;
  sVar69 = auVar185._0_2_;
  uVar191 = (ushort)(sVar87 < sVar69) * sVar69 | (ushort)(sVar87 >= sVar69) * sVar87;
  sVar69 = auVar185._2_2_;
  uVar199 = (ushort)(sVar88 < sVar69) * sVar69 | (ushort)(sVar88 >= sVar69) * sVar88;
  sVar69 = auVar185._4_2_;
  uVar200 = (ushort)(sVar89 < sVar69) * sVar69 | (ushort)(sVar89 >= sVar69) * sVar89;
  sVar69 = auVar185._6_2_;
  uVar201 = (ushort)(sVar90 < sVar69) * sVar69 | (ushort)(sVar90 >= sVar69) * sVar90;
  sVar69 = auVar185._8_2_;
  uVar202 = (ushort)(sVar111 < sVar69) * sVar69 | (ushort)(sVar111 >= sVar69) * sVar111;
  sVar69 = auVar185._10_2_;
  uVar203 = (ushort)(sVar128 < sVar69) * sVar69 | (ushort)(sVar128 >= sVar69) * sVar128;
  sVar69 = auVar185._12_2_;
  uVar204 = (ushort)(sVar131 < sVar69) * sVar69 | (ushort)(sVar131 >= sVar69) * sVar131;
  sVar69 = auVar185._14_2_;
  uVar205 = (ushort)(sVar134 < sVar69) * sVar69 | (ushort)(sVar134 >= sVar69) * sVar134;
  auVar75 = psubusw(local_2b8,auVar42);
  auVar103 = psubusw(auVar42,local_2b8);
  auVar103 = auVar103 | auVar75;
  auVar185 = psllw(_DAT_005147c0,auVar92);
  sVar69 = auVar103._0_2_;
  uVar191 = (sVar69 < (short)uVar191) * uVar191 | (ushort)(sVar69 >= (short)uVar191) * sVar69;
  sVar69 = auVar103._2_2_;
  uVar199 = (sVar69 < (short)uVar199) * uVar199 | (ushort)(sVar69 >= (short)uVar199) * sVar69;
  sVar69 = auVar103._4_2_;
  uVar200 = (sVar69 < (short)uVar200) * uVar200 | (ushort)(sVar69 >= (short)uVar200) * sVar69;
  sVar69 = auVar103._6_2_;
  uVar201 = (sVar69 < (short)uVar201) * uVar201 | (ushort)(sVar69 >= (short)uVar201) * sVar69;
  sVar69 = auVar103._8_2_;
  uVar202 = (sVar69 < (short)uVar202) * uVar202 | (ushort)(sVar69 >= (short)uVar202) * sVar69;
  sVar69 = auVar103._10_2_;
  uVar203 = (sVar69 < (short)uVar203) * uVar203 | (ushort)(sVar69 >= (short)uVar203) * sVar69;
  sVar69 = auVar103._12_2_;
  sVar83 = auVar103._14_2_;
  uVar204 = (sVar69 < (short)uVar204) * uVar204 | (ushort)(sVar69 >= (short)uVar204) * sVar69;
  uVar205 = (sVar83 < (short)uVar205) * uVar205 | (ushort)(sVar83 >= (short)uVar205) * sVar83;
  auVar77._0_2_ =
       ((short)uVar202 < (short)uVar191) * uVar191 | ((short)uVar202 >= (short)uVar191) * uVar202;
  auVar77._2_2_ =
       ((short)uVar203 < (short)uVar199) * uVar199 | ((short)uVar203 >= (short)uVar199) * uVar203;
  auVar77._4_2_ =
       ((short)uVar204 < (short)uVar200) * uVar200 | ((short)uVar204 >= (short)uVar200) * uVar204;
  auVar77._6_2_ =
       ((short)uVar205 < (short)uVar201) * uVar201 | ((short)uVar205 >= (short)uVar201) * uVar205;
  auVar77._8_2_ = (0 < (short)uVar202) * uVar202;
  auVar77._10_2_ = (0 < (short)uVar203) * uVar203;
  auVar77._12_2_ = (0 < (short)uVar204) * uVar204;
  auVar77._14_2_ = (0 < (short)uVar205) * uVar205;
  auVar75 = psubusw(auVar77,auVar185);
  auVar78._0_2_ = -(ushort)(auVar75._0_2_ == 0);
  auVar78._2_2_ = -(ushort)(auVar75._2_2_ == 0);
  auVar78._4_2_ = -(ushort)(auVar75._4_2_ == 0);
  auVar78._6_2_ = -(ushort)(auVar75._6_2_ == 0);
  auVar78._8_2_ = -(ushort)(auVar75._8_2_ == 0);
  auVar78._10_2_ = -(ushort)(auVar75._10_2_ == 0);
  auVar78._12_2_ = -(ushort)(auVar75._12_2_ == 0);
  auVar78._14_2_ = -(ushort)(auVar75._14_2_ == 0);
  auVar78 = auVar78 & auVar226;
  auVar227._0_8_ = auVar78._0_8_;
  auVar227._8_4_ = auVar78._0_4_;
  auVar227._12_4_ = auVar78._4_4_;
  auVar93._0_2_ = -(ushort)(auVar78._0_2_ == 0);
  auVar93._2_2_ = -(ushort)(auVar78._2_2_ == 0);
  auVar93._4_2_ = -(ushort)(auVar78._4_2_ == 0);
  auVar93._6_2_ = -(ushort)(auVar78._6_2_ == 0);
  auVar93._8_2_ = -(ushort)(auVar78._0_2_ == 0);
  auVar93._10_2_ = -(ushort)(auVar78._2_2_ == 0);
  auVar93._12_2_ = -(ushort)(auVar78._4_2_ == 0);
  auVar93._14_2_ = -(ushort)(auVar78._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar93 >> 7,0) & 1) | (ushort)(SUB161(auVar93 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar93 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar93 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar93 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar93 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar93 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar93 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar93 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar93 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar93 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar93 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar93._14_2_ >> 7) & 1) << 0xe | auVar93._14_2_ & 0x8000) == 0xffff
     ) {
    auVar94._8_8_ = auVar208._0_8_;
    auVar94._0_8_ = auVar120._0_8_;
    auVar195._8_8_ = auVar208._8_8_;
    auVar195._0_8_ = auVar120._8_8_;
  }
  else {
    auVar75 = psubusw(local_2a8,auVar42);
    auVar92 = psubusw(auVar42,local_2a8);
    auVar92 = auVar92 | auVar75;
    auVar75 = psubusw(local_298,auVar42);
    auVar103 = psubusw(auVar42,local_298);
    auVar103 = auVar103 | auVar75;
    sVar69 = auVar92._0_2_;
    sVar83 = auVar103._0_2_;
    uVar191 = (ushort)(sVar83 < sVar69) * sVar69 | (ushort)(sVar83 >= sVar69) * sVar83;
    sVar69 = auVar92._2_2_;
    sVar83 = auVar103._2_2_;
    uVar199 = (ushort)(sVar83 < sVar69) * sVar69 | (ushort)(sVar83 >= sVar69) * sVar83;
    sVar69 = auVar92._4_2_;
    sVar83 = auVar103._4_2_;
    uVar200 = (ushort)(sVar83 < sVar69) * sVar69 | (ushort)(sVar83 >= sVar69) * sVar83;
    sVar69 = auVar92._6_2_;
    sVar83 = auVar103._6_2_;
    uVar201 = (ushort)(sVar83 < sVar69) * sVar69 | (ushort)(sVar83 >= sVar69) * sVar83;
    sVar69 = auVar92._8_2_;
    sVar83 = auVar103._8_2_;
    uVar202 = (ushort)(sVar83 < sVar69) * sVar69 | (ushort)(sVar83 >= sVar69) * sVar83;
    sVar69 = auVar92._10_2_;
    sVar83 = auVar103._10_2_;
    uVar203 = (ushort)(sVar83 < sVar69) * sVar69 | (ushort)(sVar83 >= sVar69) * sVar83;
    sVar69 = auVar92._12_2_;
    sVar83 = auVar103._12_2_;
    sVar85 = auVar103._14_2_;
    uVar204 = (ushort)(sVar83 < sVar69) * sVar69 | (ushort)(sVar83 >= sVar69) * sVar83;
    sVar69 = auVar92._14_2_;
    uVar205 = (ushort)(sVar85 < sVar69) * sVar69 | (ushort)(sVar85 >= sVar69) * sVar85;
    auVar75 = psubusw(local_288,auVar42);
    auVar92 = psubusw(auVar42,local_288);
    auVar92 = auVar92 | auVar75;
    sVar69 = auVar92._0_2_;
    uVar191 = (sVar69 < (short)uVar191) * uVar191 | (ushort)(sVar69 >= (short)uVar191) * sVar69;
    sVar69 = auVar92._2_2_;
    uVar199 = (sVar69 < (short)uVar199) * uVar199 | (ushort)(sVar69 >= (short)uVar199) * sVar69;
    sVar69 = auVar92._4_2_;
    uVar200 = (sVar69 < (short)uVar200) * uVar200 | (ushort)(sVar69 >= (short)uVar200) * sVar69;
    sVar69 = auVar92._6_2_;
    uVar201 = (sVar69 < (short)uVar201) * uVar201 | (ushort)(sVar69 >= (short)uVar201) * sVar69;
    sVar69 = auVar92._8_2_;
    uVar202 = (sVar69 < (short)uVar202) * uVar202 | (ushort)(sVar69 >= (short)uVar202) * sVar69;
    sVar69 = auVar92._10_2_;
    uVar203 = (sVar69 < (short)uVar203) * uVar203 | (ushort)(sVar69 >= (short)uVar203) * sVar69;
    sVar69 = auVar92._12_2_;
    sVar83 = auVar92._14_2_;
    uVar204 = (sVar69 < (short)uVar204) * uVar204 | (ushort)(sVar69 >= (short)uVar204) * sVar69;
    uVar205 = (sVar83 < (short)uVar205) * uVar205 | (ushort)(sVar83 >= (short)uVar205) * sVar83;
    auVar123._0_2_ =
         ((short)uVar202 < (short)uVar191) * uVar191 | ((short)uVar202 >= (short)uVar191) * uVar202;
    auVar123._2_2_ =
         ((short)uVar203 < (short)uVar199) * uVar199 | ((short)uVar203 >= (short)uVar199) * uVar203;
    auVar123._4_2_ =
         ((short)uVar204 < (short)uVar200) * uVar200 | ((short)uVar204 >= (short)uVar200) * uVar204;
    auVar123._6_2_ =
         ((short)uVar205 < (short)uVar201) * uVar201 | ((short)uVar205 >= (short)uVar201) * uVar205;
    auVar123._8_2_ = (0 < (short)uVar202) * uVar202;
    auVar123._10_2_ = (0 < (short)uVar203) * uVar203;
    auVar123._12_2_ = (0 < (short)uVar204) * uVar204;
    auVar123._14_2_ = (0 < (short)uVar205) * uVar205;
    auVar75 = psubusw(auVar123,auVar185);
    auVar124._0_2_ = -(ushort)(auVar75._0_2_ == 0);
    auVar124._2_2_ = -(ushort)(auVar75._2_2_ == 0);
    auVar124._4_2_ = -(ushort)(auVar75._4_2_ == 0);
    auVar124._6_2_ = -(ushort)(auVar75._6_2_ == 0);
    auVar124._8_2_ = -(ushort)(auVar75._8_2_ == 0);
    auVar124._10_2_ = -(ushort)(auVar75._10_2_ == 0);
    auVar124._12_2_ = -(ushort)(auVar75._12_2_ == 0);
    auVar124._14_2_ = -(ushort)(auVar75._14_2_ == 0);
    auVar124 = auVar124 & auVar78;
    sVar206 = local_2c8._0_2_;
    sVar69 = local_2d8 + local_2e8 + sVar206;
    sVar212 = local_2c8._2_2_;
    sVar83 = sStack_2d6 + sStack_2e6 + sVar212;
    sVar213 = local_2c8._4_2_;
    sVar85 = sStack_2d4 + sStack_2e4 + sVar213;
    sVar214 = local_2c8._6_2_;
    sVar86 = sStack_2d2 + sStack_2e2 + sVar214;
    sVar141 = local_2c8._8_2_;
    sVar87 = sStack_2d0 + sStack_2e0 + sVar141;
    sVar154 = local_2c8._10_2_;
    sVar88 = sStack_2ce + sStack_2de + sVar154;
    sVar215 = local_2c8._12_2_;
    sVar89 = sStack_2cc + sStack_2dc + sVar215;
    sVar216 = local_2c8._14_2_;
    sVar90 = sStack_2ca + sStack_2da + sVar216;
    sVar160 = sVar87 + sVar69 + 4;
    sVar172 = sVar88 + sVar83 + 4;
    sVar174 = sVar89 + sVar85 + 4;
    sVar176 = sVar90 + sVar86 + 4;
    sVar111 = local_2b8._0_2_;
    sVar128 = local_2b8._2_2_;
    sVar131 = local_2b8._4_2_;
    sVar134 = local_2b8._6_2_;
    sVar156 = local_2b8._8_2_;
    sVar157 = local_2b8._10_2_;
    sVar158 = local_2b8._12_2_;
    sVar159 = local_2b8._14_2_;
    local_178 = (ushort)(local_2e8 + sVar111 + sVar160) >> 3;
    uStack_176 = (ushort)(sStack_2e6 + sVar128 + sVar172) >> 3;
    uStack_174 = (ushort)(sStack_2e4 + sVar131 + sVar174) >> 3;
    uStack_172 = (ushort)(sStack_2e2 + sVar134 + sVar176) >> 3;
    uStack_170 = (ushort)(sVar175 + sVar84 + sVar160) >> 3;
    uStack_16e = (ushort)(uVar30 + uVar27 + sVar172) >> 3;
    uStack_16c = (ushort)(sVar110 + sVar70 + sVar174) >> 3;
    uStack_16a = (ushort)(uVar38 + uVar35 + sVar176) >> 3;
    local_168 = (ushort)((sVar160 - sVar173) + local_2d8 + sVar111 * 2) >> 3;
    uStack_166 = (ushort)((sVar172 - uVar29) + sStack_2d6 + sVar128 * 2) >> 3;
    uStack_164 = (ushort)((sVar174 - sVar109) + sStack_2d4 + sVar131 * 2) >> 3;
    uStack_162 = (ushort)((sVar176 - uVar37) + sStack_2d2 + sVar134 * 2) >> 3;
    uStack_160 = (ushort)((sVar160 - sVar206) + sStack_2d0 + sVar156 * 2) >> 3;
    uStack_15e = (ushort)((sVar172 - sVar212) + sStack_2ce + sVar157 * 2) >> 3;
    uStack_15c = (ushort)((sVar174 - sVar213) + sStack_2cc + sVar158 * 2) >> 3;
    uStack_15a = (ushort)((sVar176 - sVar214) + sStack_2ca + sVar159 * 2) >> 3;
    local_158 = (ushort)(((sVar206 + sVar111 * 3) - sVar171) + (sVar160 - sVar173)) >> 3;
    uStack_156 = (ushort)(((sVar212 + sVar128 * 3) - uVar28) + (sVar172 - uVar29)) >> 3;
    uStack_154 = (ushort)(((sVar213 + sVar131 * 3) - sVar108) + (sVar174 - sVar109)) >> 3;
    uStack_152 = (ushort)(((sVar214 + sVar134 * 3) - uVar36) + (sVar176 - uVar37)) >> 3;
    uStack_150 = (ushort)(((sVar141 + sVar156 * 3) - local_2d8) + (sVar160 - sVar206)) >> 3;
    uStack_14e = (ushort)(((sVar154 + sVar157 * 3) - sStack_2d6) + (sVar172 - sVar212)) >> 3;
    uStack_14c = (ushort)(((sVar215 + sVar158 * 3) - sStack_2d4) + (sVar174 - sVar213)) >> 3;
    uStack_14a = (ushort)(((sVar216 + sVar159 * 3) - sStack_2d2) + (sVar176 - sVar214)) >> 3;
    auVar166._0_8_ = auVar124._0_8_;
    auVar166._8_4_ = auVar124._0_4_;
    auVar166._12_4_ = auVar124._4_4_;
    auVar79._0_2_ = -(ushort)(auVar124._0_2_ == 0);
    auVar79._2_2_ = -(ushort)(auVar124._2_2_ == 0);
    auVar79._4_2_ = -(ushort)(auVar124._4_2_ == 0);
    auVar79._6_2_ = -(ushort)(auVar124._6_2_ == 0);
    auVar79._8_2_ = -(ushort)(auVar124._0_2_ == 0);
    auVar79._10_2_ = -(ushort)(auVar124._2_2_ == 0);
    auVar79._12_2_ = -(ushort)(auVar124._4_2_ == 0);
    auVar79._14_2_ = -(ushort)(auVar124._6_2_ == 0);
    uVar191 = ((ushort)(SUB161(auVar79 >> 7,0) & 1) | (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar79._14_2_ >> 7) & 1) << 0xe | auVar79._14_2_ & 0x8000) ^ 0xffff;
    if (uVar191 != 0) {
      local_238 = local_298._0_2_;
      sStack_236 = local_298._2_2_;
      sStack_234 = local_298._4_2_;
      sStack_232 = local_298._6_2_;
      sStack_230 = local_298._8_2_;
      sStack_22e = local_298._10_2_;
      sStack_22c = local_298._12_2_;
      sStack_22a = local_298._14_2_;
      sVar219 = local_2a8._0_2_;
      sVar222 = local_2a8._2_2_;
      sVar223 = local_2a8._4_2_;
      sVar224 = local_2a8._6_2_;
      sStack_230 = local_2a8._8_2_ + sStack_230;
      sStack_22e = local_2a8._10_2_ + sStack_22e;
      sStack_22c = local_2a8._12_2_ + sStack_22c;
      sStack_22a = local_2a8._14_2_ + sStack_22a;
      sVar112 = sVar219 + local_238 + sVar111;
      sVar129 = sVar222 + sStack_236 + sVar128;
      sVar132 = sVar223 + sStack_234 + sVar131;
      sVar135 = sVar224 + sStack_232 + sVar134;
      sVar137 = sStack_230 + sVar156;
      sVar138 = sStack_22e + sVar157;
      sVar139 = sStack_22c + sVar158;
      sVar140 = sStack_22a + sVar159;
      sVar177 = sVar137 + sVar87 + sVar112 + sVar69 + 8;
      sVar181 = sVar138 + sVar88 + sVar129 + sVar83 + 8;
      sVar182 = sVar139 + sVar89 + sVar132 + sVar85 + 8;
      sVar183 = sVar140 + sVar90 + sVar135 + sVar86 + 8;
      sVar113 = sVar177 - auVar74._10_2_;
      sVar130 = sVar181 - uVar32;
      sVar133 = sVar182 - auVar106._10_2_;
      sVar136 = sVar183 - uVar40;
      sVar160 = local_288._0_2_;
      sVar172 = local_288._2_2_;
      sVar174 = local_288._4_2_;
      sVar176 = local_288._6_2_;
      sVar96 = local_288._8_2_;
      sVar97 = local_288._10_2_;
      sVar99 = local_288._12_2_;
      sVar100 = local_288._14_2_;
      local_148 = (ushort)(sVar84 + local_2d8 + local_2e8 + sVar160 + sVar177) >> 4;
      uStack_146 = (ushort)(uVar27 + sStack_2d6 + sStack_2e6 + sVar172 + sVar181) >> 4;
      uStack_144 = (ushort)(sVar70 + sStack_2d4 + sStack_2e4 + sVar174 + sVar182) >> 4;
      uStack_142 = (ushort)(uVar35 + sStack_2d2 + sStack_2e2 + sVar176 + sVar183) >> 4;
      uStack_140 = (ushort)(local_2e8 + sStack_2d0 + sStack_2e0 + sVar96 + sVar177) >> 4;
      uStack_13e = (ushort)(sStack_2e6 + sStack_2ce + sStack_2de + sVar97 + sVar181) >> 4;
      uStack_13c = (ushort)(sStack_2e4 + sStack_2cc + sStack_2dc + sVar99 + sVar182) >> 4;
      uStack_13a = (ushort)(sStack_2e2 + sStack_2ca + sStack_2da + sVar100 + sVar183) >> 4;
      local_138 = (ushort)(sVar113 + sVar69 + sVar160 * 2) >> 4;
      uStack_136 = (ushort)(sVar130 + sVar83 + sVar172 * 2) >> 4;
      uStack_134 = (ushort)(sVar133 + sVar85 + sVar174 * 2) >> 4;
      uStack_132 = (ushort)(sVar136 + sVar86 + sVar176 * 2) >> 4;
      uStack_130 = (ushort)((sVar177 - local_238) + sVar87 + sVar96 * 2) >> 4;
      uStack_12e = (ushort)((sVar181 - sStack_236) + sVar88 + sVar97 * 2) >> 4;
      uStack_12c = (ushort)((sVar182 - sStack_234) + sVar89 + sVar99 * 2) >> 4;
      uStack_12a = (ushort)((sVar183 - sStack_232) + sVar90 + sVar100 * 2) >> 4;
      sVar113 = sVar113 - auVar74._8_2_;
      sVar130 = sVar130 - uVar31;
      sVar133 = sVar133 - auVar106._8_2_;
      sVar136 = sVar136 - uVar39;
      sVar70 = (sVar177 - local_238) - sVar219;
      sVar84 = (sVar181 - sStack_236) - sVar222;
      sVar69 = (sVar182 - sStack_234) - sVar223;
      sVar83 = (sVar183 - sStack_232) - sVar224;
      local_128 = (ushort)(sVar113 + local_2d8 + sVar206 + sVar111 + sVar160 * 3) >> 4;
      uStack_126 = (ushort)(sVar130 + sStack_2d6 + sVar212 + sVar128 + sVar172 * 3) >> 4;
      uStack_124 = (ushort)(sVar133 + sStack_2d4 + sVar213 + sVar131 + sVar174 * 3) >> 4;
      uStack_122 = (ushort)(sVar136 + sStack_2d2 + sVar214 + sVar134 + sVar176 * 3) >> 4;
      uStack_120 = (ushort)(sVar70 + sStack_2d0 + sVar141 + sVar156 + sVar96 * 3) >> 4;
      uStack_11e = (ushort)(sVar84 + sStack_2ce + sVar154 + sVar157 + sVar97 * 3) >> 4;
      uStack_11c = (ushort)(sVar69 + sStack_2cc + sVar215 + sVar158 + sVar99 * 3) >> 4;
      uStack_11a = (ushort)(sVar83 + sStack_2ca + sVar216 + sVar159 + sVar100 * 3) >> 4;
      sVar113 = sVar113 - sVar175;
      sVar130 = sVar130 - uVar30;
      sVar133 = sVar133 - sVar110;
      sVar136 = sVar136 - uVar38;
      auVar106 = psllw(local_288,2);
      sVar70 = sVar70 - sVar111;
      sVar84 = sVar84 - sVar128;
      sVar69 = sVar69 - sVar131;
      sVar83 = sVar83 - sVar134;
      local_118 = (ushort)(sVar113 + sVar111 + sVar219 + sVar206 + auVar106._0_2_) >> 4;
      uStack_116 = (ushort)(sVar130 + sVar128 + sVar222 + sVar212 + auVar106._2_2_) >> 4;
      uStack_114 = (ushort)(sVar133 + sVar131 + sVar223 + sVar213 + auVar106._4_2_) >> 4;
      uStack_112 = (ushort)(sVar136 + sVar134 + sVar224 + sVar214 + auVar106._6_2_) >> 4;
      uStack_110 = (ushort)(sVar70 + sVar156 + local_2a8._8_2_ + sVar141 + auVar106._8_2_) >> 4;
      uStack_10e = (ushort)(sVar84 + sVar157 + local_2a8._10_2_ + sVar154 + auVar106._10_2_) >> 4;
      uStack_10c = (ushort)(sVar69 + sVar158 + local_2a8._12_2_ + sVar215 + auVar106._12_2_) >> 4;
      uStack_10a = (ushort)(sVar83 + sVar159 + local_2a8._14_2_ + sVar216 + auVar106._14_2_) >> 4;
      sVar113 = sVar113 - sVar173;
      sVar130 = sVar130 - uVar29;
      sVar133 = sVar133 - sVar109;
      sVar136 = sVar136 - uVar37;
      sVar70 = sVar70 - sVar206;
      sVar84 = sVar84 - sVar212;
      sVar69 = sVar69 - sVar213;
      sVar83 = sVar83 - sVar214;
      local_108 = (ushort)(sVar113 + auVar106._0_2_ + sVar160 + sVar112) >> 4;
      uStack_106 = (ushort)(sVar130 + auVar106._2_2_ + sVar172 + sVar129) >> 4;
      uStack_104 = (ushort)(sVar133 + auVar106._4_2_ + sVar174 + sVar132) >> 4;
      uStack_102 = (ushort)(sVar136 + auVar106._6_2_ + sVar176 + sVar135) >> 4;
      uStack_100 = (ushort)(sVar70 + auVar106._8_2_ + sVar96 + sVar137) >> 4;
      uStack_fe = (ushort)(sVar84 + auVar106._10_2_ + sVar97 + sVar138) >> 4;
      uStack_fc = (ushort)(sVar69 + auVar106._12_2_ + sVar99 + sVar139) >> 4;
      uStack_fa = (ushort)(sVar83 + auVar106._14_2_ + sVar100 + sVar140) >> 4;
      local_f8 = (ushort)(((sVar219 + local_238 + sVar160 * 7) - sVar171) + sVar113) >> 4;
      uStack_f6 = (ushort)(((sVar222 + sStack_236 + sVar172 * 7) - uVar28) + sVar130) >> 4;
      uStack_f4 = (ushort)(((sVar223 + sStack_234 + sVar174 * 7) - sVar108) + sVar133) >> 4;
      uStack_f2 = (ushort)(((sVar224 + sStack_232 + sVar176 * 7) - uVar36) + sVar136) >> 4;
      uStack_f0 = (ushort)(((sStack_230 + sVar96 * 7) - local_2d8) + sVar70) >> 4;
      uStack_ee = (ushort)(((sStack_22e + sVar97 * 7) - sStack_2d6) + sVar84) >> 4;
      uStack_ec = (ushort)(((sStack_22c + sVar99 * 7) - sStack_2d4) + sVar69) >> 4;
      uStack_ea = (ushort)(((sStack_22a + sVar100 * 7) - sStack_2d2) + sVar83) >> 4;
    }
    local_2e8 = auVar120._0_2_;
    sStack_2e6 = auVar120._2_2_;
    sStack_2e4 = auVar120._4_2_;
    sStack_2e2 = auVar120._6_2_;
    sStack_2e0 = auVar208._0_2_;
    sStack_2de = auVar208._2_2_;
    sStack_2dc = auVar208._4_2_;
    sStack_2da = auVar208._6_2_;
    local_2d8 = auVar120._8_2_;
    sStack_2d6 = auVar120._10_2_;
    sStack_2d4 = auVar120._12_2_;
    sStack_2d2 = auVar120._14_2_;
    sStack_2d0 = auVar208._8_2_;
    sStack_2ce = auVar208._10_2_;
    sStack_2cc = auVar208._12_2_;
    sStack_2ca = auVar208._14_2_;
    auVar80._8_4_ = 0xffffffff;
    auVar80._0_8_ = 0xffffffffffffffff;
    auVar80._12_4_ = 0xffffffff;
    lVar66 = 0;
    do {
      auVar106 = *(undefined1 (*) [16])((long)&local_178 + lVar66) & auVar227;
      *(undefined1 (*) [16])((long)&local_178 + lVar66) = auVar106;
      *(undefined1 (*) [16])((long)&local_2e8 + lVar66) =
           auVar106 | *(undefined1 (*) [16])((long)&local_2e8 + lVar66) & (auVar80 ^ auVar227);
      lVar66 = lVar66 + 0x10;
    } while (lVar66 != 0x30);
    if (uVar191 != 0) {
      auVar81._8_4_ = 0xffffffff;
      auVar81._0_8_ = 0xffffffffffffffff;
      auVar81._12_4_ = 0xffffffff;
      lVar66 = 0;
      do {
        auVar106 = *(undefined1 (*) [16])((long)&local_148 + lVar66) & auVar166;
        *(undefined1 (*) [16])((long)&local_148 + lVar66) = auVar106;
        *(undefined1 (*) [16])((long)&local_2e8 + lVar66) =
             auVar106 | *(undefined1 (*) [16])((long)&local_2e8 + lVar66) & (auVar81 ^ auVar166);
        lVar66 = lVar66 + 0x10;
      } while (lVar66 != 0x60);
    }
    auVar94._2_2_ = sStack_2e6;
    auVar94._0_2_ = local_2e8;
    auVar94._4_2_ = sStack_2e4;
    auVar94._6_2_ = sStack_2e2;
    auVar94._8_2_ = sStack_2e0;
    auVar94._10_2_ = sStack_2de;
    auVar94._12_2_ = sStack_2dc;
    auVar94._14_2_ = sStack_2da;
    auVar195._2_2_ = sStack_2d6;
    auVar195._0_2_ = local_2d8;
    auVar195._4_2_ = sStack_2d4;
    auVar195._6_2_ = sStack_2d2;
    auVar195._8_2_ = sStack_2d0;
    auVar195._10_2_ = sStack_2ce;
    auVar195._12_2_ = sStack_2cc;
    auVar195._14_2_ = sStack_2ca;
  }
  uVar71 = CONCAT22(auVar195._8_2_,auVar94._8_2_);
  auVar73._0_8_ = CONCAT26(auVar195._10_2_,CONCAT24(auVar94._10_2_,uVar71));
  auVar73._8_2_ = auVar94._12_2_;
  auVar73._10_2_ = auVar195._12_2_;
  auVar82._12_2_ = auVar94._14_2_;
  auVar82._0_12_ = auVar73;
  auVar82._14_2_ = auVar195._14_2_;
  auVar198._0_12_ = auVar195._0_12_;
  auVar198._12_2_ = auVar195._6_2_;
  auVar198._14_2_ = auVar94._6_2_;
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._0_10_ = auVar195._0_10_;
  auVar197._10_2_ = auVar94._4_2_;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._0_8_ = auVar195._0_8_;
  auVar196._8_2_ = auVar195._4_2_;
  auVar53._4_8_ = auVar196._8_8_;
  auVar53._2_2_ = auVar94._2_2_;
  auVar53._0_2_ = auVar195._2_2_;
  auVar64._4_8_ = auVar155._8_8_;
  auVar64._0_4_ = uVar142;
  auVar64._12_4_ = 0;
  auVar180._0_12_ = SUB1612(auVar64 << 0x20,0);
  auVar180._12_2_ = uVar25;
  auVar180._14_2_ = uVar26;
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._0_10_ = SUB1610(auVar64 << 0x20,0);
  auVar179._10_2_ = auVar107._2_2_;
  auVar65._4_2_ = auVar107._0_2_;
  auVar65._0_4_ = uVar142;
  auVar65._6_6_ = auVar179._10_6_;
  auVar54._4_8_ = auVar65._4_8_;
  auVar54._2_2_ = uVar24;
  auVar54._0_2_ = uVar23;
  auVar178._0_4_ = auVar95._0_4_;
  auVar178._4_12_ = auVar54;
  auVar127._0_12_ = local_298._0_12_;
  auVar127._12_2_ = local_298._6_2_;
  auVar127._14_2_ = local_2a8._6_2_;
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._0_10_ = local_298._0_10_;
  auVar126._10_2_ = local_2a8._4_2_;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._0_8_ = local_298._0_8_;
  auVar125._8_2_ = local_298._4_2_;
  auVar55._4_8_ = auVar125._8_8_;
  auVar55._2_2_ = local_2a8._2_2_;
  auVar55._0_2_ = local_298._2_2_;
  auVar152._0_12_ = local_2b8._0_12_;
  auVar152._12_2_ = local_2b8._6_2_;
  auVar152._14_2_ = local_2c8._6_2_;
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_10_ = local_2b8._0_10_;
  auVar151._10_2_ = local_2c8._4_2_;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._0_8_ = local_2b8._0_8_;
  auVar150._8_2_ = local_2b8._4_2_;
  auVar56._4_8_ = auVar150._8_8_;
  auVar56._2_2_ = local_2c8._2_2_;
  auVar56._0_2_ = local_2b8._2_2_;
  auVar149._0_4_ = CONCAT22(local_2c8._0_2_,local_2b8._0_2_);
  auVar149._4_12_ = auVar56;
  auVar95._0_8_ = auVar178._0_8_;
  auVar95._8_4_ = auVar54._0_4_;
  auVar95._12_4_ = auVar55._0_4_;
  auVar167._0_8_ = auVar149._0_8_;
  auVar167._8_4_ = auVar56._0_4_;
  auVar167._12_4_ = auVar53._0_4_;
  uVar101 = CONCAT22(local_2b8._8_2_,local_2c8._8_2_);
  auVar207._0_8_ = CONCAT26(local_2b8._10_2_,CONCAT24(local_2c8._10_2_,uVar101));
  auVar207._8_2_ = local_2c8._12_2_;
  auVar207._10_2_ = local_2b8._12_2_;
  auVar211._12_2_ = local_2c8._14_2_;
  auVar211._0_12_ = auVar207;
  auVar211._14_2_ = local_2b8._14_2_;
  uVar142 = CONCAT22(local_298._8_2_,local_2a8._8_2_);
  auVar217._0_8_ = CONCAT26(local_298._10_2_,CONCAT24(local_2a8._10_2_,uVar142));
  auVar217._8_2_ = local_2a8._12_2_;
  auVar217._10_2_ = local_298._12_2_;
  auVar218._12_2_ = local_2a8._14_2_;
  auVar218._0_12_ = auVar217;
  auVar218._14_2_ = local_298._14_2_;
  auVar170._8_4_ = 0;
  auVar170._0_8_ = local_18;
  auVar170._12_2_ = uVar41;
  auVar170._14_2_ = uVar41;
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = local_18;
  auVar169._10_2_ = uVar98;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._8_2_ = uVar98;
  auVar168._0_8_ = local_18;
  auVar57._4_8_ = auVar168._8_8_;
  auVar57._2_2_ = uVar34;
  auVar57._0_2_ = uVar33;
  auVar107._8_4_ = (int)((ulong)auVar73._0_8_ >> 0x20);
  auVar107._0_8_ = auVar73._0_8_;
  auVar107._12_4_ = (int)((ulong)auVar207._0_8_ >> 0x20);
  auVar153._8_4_ = (int)((ulong)auVar217._0_8_ >> 0x20);
  auVar153._0_8_ = auVar217._0_8_;
  auVar153._12_4_ = auVar57._0_4_;
  *(ulong *)(s + -8) = CONCAT44(CONCAT22(local_2a8._0_2_,local_298._0_2_),auVar178._0_4_);
  *(ulong *)(s + -4) = CONCAT44(CONCAT22(auVar94._0_2_,auVar195._0_2_),auVar149._0_4_);
  *(ulong *)s = CONCAT44(uVar101,uVar71);
  *(ulong *)(s + 4) = CONCAT44(auVar74._12_4_,uVar142);
  *(long *)(s + (long)pitch + -8) = auVar95._8_8_;
  *(long *)(s + (long)pitch + -8 + 4) = auVar167._8_8_;
  *(long *)(s + pitch) = auVar107._8_8_;
  *(long *)(s + pitch + 4) = auVar153._8_8_;
  puVar1 = s + lVar67 + -8;
  *(int *)puVar1 = auVar65._4_4_;
  *(int *)(puVar1 + 2) = auVar125._8_4_;
  *(int *)(puVar1 + 4) = auVar150._8_4_;
  *(int *)(puVar1 + 6) = auVar196._8_4_;
  puVar1 = s + lVar67;
  *(int *)puVar1 = auVar73._8_4_;
  *(int *)(puVar1 + 2) = auVar207._8_4_;
  *(int *)(puVar1 + 4) = auVar217._8_4_;
  *(int *)(puVar1 + 6) = auVar168._8_4_;
  *(undefined4 *)(s + lVar68 + -4) = auVar179._12_4_;
  *(undefined4 *)(s + lVar68 + -2) = auVar126._12_4_;
  *(undefined4 *)(s + lVar68) = auVar151._12_4_;
  *(undefined4 *)(s + lVar68 + 2) = auVar197._12_4_;
  *(int *)(s + lVar68 + 4) = auVar82._12_4_;
  *(int *)(s + lVar68 + 6) = auVar211._12_4_;
  *(int *)(s + lVar68 + 8) = auVar218._12_4_;
  *(undefined4 *)(s + lVar68 + 10) = auVar169._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_14_sse2(uint16_t *s, int pitch,
                                     const uint8_t *blimit,
                                     const uint8_t *limit,
                                     const uint8_t *thresh, int bd) {
  __m128i q[7], p[7], pq[7];
  __m128i p6, p5, p4, p3;
  __m128i p6_2, p5_2, p4_2, p3_2;
  __m128i d0, d1, d2, d3;
  __m128i d0_2, d1_2, d2_2, d3_2, d7_2;

  p6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * pitch));
  p5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * pitch));
  p4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * pitch));
  p3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * pitch));

  highbd_transpose4x8_8x4_sse2(&p6, &p5, &p4, &p3, &d0, &p[6], &p[5], &p[4],
                               &p[3], &p[2], &p[1], &p[0]);

  p6_2 = _mm_loadu_si128((__m128i *)(s + 0 * pitch));
  p5_2 = _mm_loadu_si128((__m128i *)(s + 1 * pitch));
  p4_2 = _mm_loadu_si128((__m128i *)(s + 2 * pitch));
  p3_2 = _mm_loadu_si128((__m128i *)(s + 3 * pitch));

  highbd_transpose4x8_8x4_sse2(&p6_2, &p5_2, &p4_2, &p3_2, &q[0], &q[1], &q[2],
                               &q[3], &q[4], &q[5], &q[6], &d7_2);

  highbd_lpf_internal_14_sse2(p, q, pq, blimit, limit, thresh, bd);

  highbd_transpose8x8_low_sse2(&d0, &p[6], &pq[5], &pq[4], &pq[3], &pq[2],
                               &pq[1], &pq[0], &d0, &d1, &d2, &d3);

  q[0] = _mm_srli_si128(pq[0], 8);
  q[1] = _mm_srli_si128(pq[1], 8);
  q[2] = _mm_srli_si128(pq[2], 8);
  q[3] = _mm_srli_si128(pq[3], 8);
  q[4] = _mm_srli_si128(pq[4], 8);
  q[5] = _mm_srli_si128(pq[5], 8);

  highbd_transpose8x8_low_sse2(&q[0], &q[1], &q[2], &q[3], &q[4], &q[5], &q[6],
                               &d7_2, &d0_2, &d1_2, &d2_2, &d3_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 0 * pitch), d0);
  _mm_storeu_si128((__m128i *)(s + 0 * pitch), d0_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 1 * pitch), d1);
  _mm_storeu_si128((__m128i *)(s + 1 * pitch), d1_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 2 * pitch), d2);
  _mm_storeu_si128((__m128i *)(s + 2 * pitch), d2_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 3 * pitch), d3);
  _mm_storeu_si128((__m128i *)(s + 3 * pitch), d3_2);
}